

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void undo_delete_line(Am_Object *line,Am_Object *obj,bool vis)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  Am_Value *pAVar4;
  Am_Value *this;
  Am_Wrapper *pAVar5;
  ushort uVar6;
  Am_Slot_Key local_52;
  Am_Slot_Key where_in_o2;
  Am_Slot_Key slot;
  Am_Object o2;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object owner;
  bool vis_local;
  Am_Object *obj_local;
  Am_Object *line_local;
  
  owner.data._7_1_ = vis;
  uVar3 = Am_Object::Valid();
  if ((uVar3 & 1) != 0) {
    uVar6 = (ushort)line;
    if ((owner.data._7_1_ & 1) == 0) {
      Am_Object::Get_Owner(&o2,(Am_Slot_Flags)line);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&o2);
      Am_Object::Set(uVar6,(Am_Wrapper *)0x170,(ulong)pAVar5);
      Am_Object::~Am_Object(&o2);
      Am_Object::Remove_From_Owner();
    }
    else {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x170);
      Am_Object::Am_Object(&local_28,pAVar4);
      Am_Object::Am_Object(&local_30,(Am_Object *)line);
      Am_Object::Add_Part((Am_Object *)&local_28,SUB81(&local_30,0),1);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&local_28);
    }
    pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_1);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffb0,pAVar4);
    local_52 = INPUT_WAS;
    bVar1 = Am_Object::operator==((Am_Object *)&stack0xffffffffffffffb0,(Am_Object *)obj);
    if ((bVar1 & 1) != 0) {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)OUTPUT_1);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffb0,pAVar4);
      local_52 = OUTPUT_WAS;
    }
    this = (Am_Value *)Am_Object::Get(uVar6,(ulong)local_52);
    uVar2 = Am_Value::operator_cast_to_int(this);
    if ((ushort)uVar2 == OUTPUT_1) {
      line_for_list((Am_Object *)&stack0xffffffffffffffb0,line,(bool)(~owner.data._7_1_ & 1));
    }
    else if ((owner.data._7_1_ & 1) == 0) {
      Am_Object::Set((ushort)&stack0xffffffffffffffb0,uVar2 & 0xffff,0);
    }
    else {
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(line);
      Am_Object::Set((ushort)&stack0xffffffffffffffb0,(Am_Wrapper *)(ulong)(ushort)uVar2,
                     (ulong)pAVar5);
    }
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void undo_delete_line(Am_Object &line, Am_Object& obj, bool vis) {
  if (line.Valid()) {
    // line.Set(Am_VISIBLE, vis);
    if (vis) {
      Am_Object owner = line.Get(Am_SAVED_OLD_OWNER);
      owner.Add_Part(line);
    }
    else {
      line.Set(Am_SAVED_OLD_OWNER, line.Get_Owner(), Am_OK_IF_NOT_THERE);
      line.Remove_From_Owner();
    }
    Am_Object o2 = line.Get(INPUT_1);
    Am_Slot_Key slot = INPUT_WAS;
    if (o2 == obj) {
      o2 = line.Get(OUTPUT_1);
      slot = OUTPUT_WAS;
    }
    Am_Slot_Key where_in_o2 = (int)line.Get(slot);
    if (where_in_o2 == OUTPUT_1) line_for_list(o2, line, !vis);
    else {
      if (vis) o2.Set(where_in_o2, line);
      else o2.Set(where_in_o2, 0);
    }
  }
}